

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void md5_append(md5_state_t *pms,md5_byte_t *data,size_t nbytes)

{
  uint uVar1;
  ulong uVar2;
  size_t local_50;
  size_t copy;
  md5_word_t nbits;
  size_t offset;
  size_t left;
  md5_byte_t *p;
  size_t nbytes_local;
  md5_byte_t *data_local;
  md5_state_t *pms_local;
  
  uVar2 = (ulong)(pms->count[0] >> 3 & 0x3f);
  uVar1 = (uint)(nbytes << 3);
  if (nbytes != 0) {
    pms->count[1] = (int)(nbytes >> 0x1d) + pms->count[1];
    pms->count[0] = uVar1 + pms->count[0];
    if (pms->count[0] < uVar1) {
      pms->count[1] = pms->count[1] + 1;
    }
    offset = nbytes;
    left = (size_t)data;
    if (uVar2 != 0) {
      local_50 = nbytes;
      if (0x40 < uVar2 + nbytes) {
        local_50 = 0x40 - uVar2;
      }
      memcpy(pms->buf + uVar2,data,local_50);
      if (uVar2 + local_50 < 0x40) {
        return;
      }
      left = (size_t)(data + local_50);
      offset = nbytes - local_50;
      md5_process(pms,pms->buf);
    }
    for (; 0x3f < offset; offset = offset - 0x40) {
      md5_process(pms,(md5_byte_t *)left);
      left = left + 0x40;
    }
    if (offset != 0) {
      memcpy(pms->buf,(void *)left,offset);
    }
  }
  return;
}

Assistant:

static void md5_append(md5_state_t *pms, const md5_byte_t *data, size_t nbytes)
{
    const md5_byte_t *p = data;
    size_t left = nbytes;
    size_t offset = (pms->count[0] >> 3) & 63;
    md5_word_t nbits = (md5_word_t)(nbytes << 3);

    if (nbytes <= 0)
        return;

    /* Update the message length. */
    pms->count[1] += (md5_word_t)(nbytes >> 29);
    pms->count[0] += nbits;
    if (pms->count[0] < nbits)
        pms->count[1]++;

    /* Process an initial partial block. */
    if (offset) {
        size_t copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

        memcpy(pms->buf + offset, p, copy);
        if (offset + copy < 64)
            return;
        p += copy;
        left -= copy;
        md5_process(pms, pms->buf);
    }

    /* Process full blocks. */
    for (; left >= 64; p += 64, left -= 64)
        md5_process(pms, p);

    /* Process a final partial block. */
    if (left)
        memcpy(pms->buf, p, left);
}